

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O3

Result __thiscall
wabt::interp::Memory::AtomicRmw<unsigned_int,unsigned_int(*&)(unsigned_int,unsigned_int)>
          (Memory *this,u64 offset,u64 addend,uint rhs,BinopFunc<unsigned_int,_unsigned_int> **func,
          uint *out)

{
  ulong uVar1;
  uint uVar2;
  pointer puVar3;
  uint uVar4;
  ulong uVar5;
  Enum EVar6;
  
  puVar3 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (long)(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar3;
  EVar6 = Error;
  if ((((3 < uVar5) && (offset <= uVar5)) && (addend <= uVar5)) &&
     ((uVar1 = addend + offset, (uVar1 & 3) == 0 && (uVar1 + 4 <= uVar5)))) {
    uVar2 = *(uint *)(puVar3 + uVar1);
    uVar4 = (**func)(uVar2,rhs);
    puVar3 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar5 = (long)(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar3;
    if (((uVar1 + 4 <= uVar5) && ((3 < uVar5 && (offset <= uVar5)))) && (addend <= uVar5)) {
      *(uint *)(puVar3 + uVar1) = uVar4;
      *out = uVar2;
      EVar6 = Ok;
    }
  }
  return (Result)EVar6;
}

Assistant:

Result Memory::AtomicRmw(u64 offset, u64 addend, T rhs, F&& func, T* out) {
  T lhs;
  CHECK_RESULT(AtomicLoad(offset, addend, &lhs));
  CHECK_RESULT(AtomicStore(offset, addend, func(lhs, rhs)));
  *out = lhs;
  return Result::Ok;
}